

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

mp_int * mp_invert_mod_2to(mp_int *x,size_t p)

{
  BignumInt *pBVar1;
  BignumInt *pBVar2;
  byte bVar3;
  size_t i;
  mp_int *pmVar4;
  mp_int *pmVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  BignumInt BVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  BignumInt *pBVar19;
  BignumInt *pBVar20;
  mp_int scratch;
  mp_int scratch_00;
  mp_int scratch_01;
  mp_int r0;
  mp_int r1;
  mp_int x1;
  mp_int K;
  mp_int r0x1;
  mp_int Kshift;
  mp_int x0;
  mp_int local_c8;
  mp_int *local_b8;
  BignumInt *local_b0;
  ulong local_a8;
  size_t local_a0;
  BignumInt *local_98;
  mp_int local_90;
  mp_int local_80;
  mp_int local_70;
  mp_int local_60;
  mp_int local_50;
  mp_int local_40;
  
  if (x->nw == 0) {
    __assert_fail("x->nw > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                  ,0x50a,"mp_int *mp_invert_mod_2to(mp_int *, size_t)");
  }
  if ((*x->w & 1) == 0) {
    __assert_fail("x->w[0] & 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                  ,0x50b,"mp_int *mp_invert_mod_2to(mp_int *, size_t)");
  }
  if (p == 0) {
    __assert_fail("p > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                  ,0x50c,"mp_int *mp_invert_mod_2to(mp_int *, size_t)");
  }
  uVar18 = p + 0x3f >> 6;
  uVar18 = uVar18 + (uVar18 == 0);
  pmVar4 = mp_make_sized(uVar18);
  uVar13 = uVar18 * 2;
  if (uVar18 <= uVar18 * 2) {
    uVar13 = uVar18;
  }
  uVar17 = uVar13 * 6;
  pmVar5 = mp_make_sized((uVar18 + uVar13) * 6);
  uVar18 = pmVar5->nw;
  uVar8 = uVar18 + uVar13 * -6;
  if (uVar17 <= uVar18) {
    if (uVar8 < uVar18) {
      uVar18 = uVar8;
    }
    pBVar1 = pmVar5->w;
    *pmVar4->w = 1;
    local_b8 = pmVar5;
    if (p != 1) {
      pBVar19 = pBVar1 + uVar13 * 6;
      uVar8 = 1;
      local_b0 = pBVar19;
      local_a8 = uVar18;
      local_a0 = p;
      do {
        uVar18 = uVar8 + 0x3f >> 6;
        if (local_a8 < uVar18) goto LAB_0012754e;
        uVar11 = local_a8 - uVar18;
        if (local_a8 <= local_a8 - uVar18) {
          uVar11 = local_a8;
        }
        uVar14 = x->nw;
        if (uVar18 < x->nw) {
          uVar14 = uVar18;
        }
        local_40.nw = uVar18;
        local_40.w = pBVar19;
        memmove(pBVar19,x->w,uVar14 * 8);
        smemclr(pBVar19 + uVar14,(uVar18 - uVar14) * 8);
        uVar14 = uVar8 >> 6;
        bVar3 = (byte)uVar8;
        if (uVar14 < uVar18) {
          uVar6 = ~(-1L << (bVar3 & 0x3f));
          uVar10 = uVar14;
          do {
            pBVar19[uVar10] = pBVar19[uVar10] & uVar6;
            uVar10 = uVar10 + 1;
            uVar6 = 0;
          } while (uVar18 != uVar10);
        }
        uVar10 = uVar8 * 2 + 0x3f >> 6;
        local_c8.w = pmVar4->w;
        local_c8.nw = pmVar4->nw;
        if (uVar18 <= pmVar4->nw) {
          local_c8.nw = uVar18;
        }
        if (uVar11 < uVar10) goto LAB_0012754e;
        pBVar19 = pBVar19 + uVar18;
        if (uVar11 - uVar10 < uVar11) {
          uVar11 = uVar11 - uVar10;
        }
        scratch.w = pBVar1;
        scratch.nw = uVar17;
        local_50.nw = uVar10;
        local_50.w = pBVar19;
        mp_mul_internal(&local_50,&local_40,&local_c8,scratch);
        uVar6 = uVar11 - uVar18;
        if (uVar11 < uVar18) goto LAB_0012754e;
        pBVar20 = pBVar19 + uVar10;
        local_70.nw = uVar18;
        local_70.w = pBVar20;
        mp_rshift_fixed_into(&local_70,&local_50,uVar8);
        if (uVar6 < uVar18) goto LAB_0012754e;
        if (uVar6 < uVar11) {
          uVar11 = uVar6;
        }
        local_98 = pBVar20 + uVar18;
        uVar6 = uVar11 - uVar18;
        if (uVar11 <= uVar11 - uVar18) {
          uVar6 = uVar11;
        }
        local_80.nw = uVar18;
        local_80.w = local_98;
        mp_rshift_fixed_into(&local_80,x,uVar8);
        if (uVar14 < uVar18) {
          uVar11 = ~(-1L << (bVar3 & 0x3f));
          lVar15 = 0;
          do {
            pBVar1[uVar13 * 6 + uVar10 + uVar14 + uVar18 * 2 + lVar15] =
                 pBVar1[uVar13 * 6 + uVar10 + uVar14 + uVar18 * 2 + lVar15] & uVar11;
            lVar15 = lVar15 + 1;
            uVar11 = 0;
          } while (uVar18 - uVar14 != lVar15);
        }
        uVar11 = uVar18;
        if (uVar10 < uVar18) {
          uVar11 = uVar10;
        }
        scratch_00.w = pBVar1;
        scratch_00.nw = uVar17;
        local_60.nw = uVar11;
        local_60.w = pBVar19;
        mp_mul_internal(&local_60,&local_c8,&local_80,scratch_00);
        if (uVar11 != 0) {
          uVar16 = 0;
          uVar7 = 0;
          do {
            if (uVar7 < uVar18) {
              BVar12 = pBVar20[uVar7];
            }
            else {
              BVar12 = 0;
            }
            uVar9 = uVar16 + pBVar19[uVar7];
            uVar16 = (ulong)CARRY8(uVar16,pBVar19[uVar7]) + (ulong)CARRY8(uVar9,BVar12);
            pBVar19[uVar7] = uVar9 + BVar12;
            uVar7 = uVar7 + 1;
          } while (uVar11 != uVar7);
          uVar16 = 1;
          uVar7 = 0;
          do {
            BVar12 = ~pBVar19[uVar7] + uVar16;
            uVar16 = (ulong)CARRY8(~pBVar19[uVar7],uVar16);
            pBVar19[uVar7] = BVar12;
            uVar7 = uVar7 + 1;
          } while (uVar11 != uVar7);
        }
        if (uVar6 < uVar18) goto LAB_0012754e;
        local_90.w = local_98 + uVar18;
        scratch_01.w = pBVar1;
        scratch_01.nw = uVar17;
        local_90.nw = uVar18;
        mp_mul_internal(&local_90,&local_c8,&local_60,scratch_01);
        pBVar19 = local_b0;
        if (uVar14 < uVar18) {
          uVar11 = ~(-1L << (bVar3 & 0x3f));
          lVar15 = 0;
          do {
            pBVar1[uVar13 * 6 + uVar10 + uVar18 * 3 + uVar14 + lVar15] =
                 pBVar1[uVar13 * 6 + uVar10 + uVar18 * 3 + uVar14 + lVar15] & uVar11;
            lVar15 = lVar15 + 1;
            uVar11 = 0;
          } while (uVar18 - uVar14 != lVar15);
        }
        mp_lshift_fixed_into(&local_70,&local_90,(ulong)((uint)uVar8 & 0x3f));
        uVar11 = pmVar4->nw;
        uVar6 = uVar14;
        if (uVar11 < uVar14) {
          uVar6 = uVar11;
        }
        uVar7 = uVar11 - uVar6;
        if (uVar10 - uVar14 <= uVar11 - uVar6) {
          uVar7 = uVar10 - uVar14;
        }
        if (uVar7 != 0) {
          pBVar2 = pmVar4->w;
          uVar14 = 0;
          uVar11 = 0;
          do {
            if (uVar11 < uVar18) {
              BVar12 = pBVar20[uVar11];
            }
            else {
              BVar12 = 0;
            }
            uVar10 = uVar14 + pBVar2[uVar6 + uVar11];
            uVar14 = (ulong)CARRY8(uVar14,pBVar2[uVar6 + uVar11]) + (ulong)CARRY8(uVar10,BVar12);
            if (pBVar2 != (BignumInt *)0x0) {
              pBVar2[uVar6 + uVar11] = uVar10 + BVar12;
            }
            uVar11 = uVar11 + 1;
          } while (uVar7 != uVar11);
        }
        uVar8 = uVar8 * 2;
        p = local_a0;
      } while (uVar8 < local_a0);
    }
    uVar18 = p >> 6;
    uVar13 = pmVar4->nw;
    if (uVar18 < uVar13) {
      uVar17 = ~(-1L << ((byte)p & 0x3f));
      pBVar1 = pmVar4->w;
      do {
        pBVar1[uVar18] = pBVar1[uVar18] & uVar17;
        uVar18 = uVar18 + 1;
        uVar17 = 0;
      } while (uVar13 != uVar18);
    }
    mp_free(local_b8);
    return pmVar4;
  }
LAB_0012754e:
  __assert_fail("len <= pool->nw",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                699,"mp_int mp_alloc_from_scratch(mp_int *, size_t)");
}

Assistant:

mp_int *mp_invert_mod_2to(mp_int *x, size_t p)
{
    /* Input checks: x must be coprime to the modulus, i.e. odd, and p
     * can't be zero */
    assert(x->nw > 0);
    assert(x->w[0] & 1);
    assert(p > 0);

    size_t rw = (p + BIGNUM_INT_BITS - 1) / BIGNUM_INT_BITS;
    rw = size_t_max(rw, 1);
    mp_int *r = mp_make_sized(rw);

    size_t mul_scratchsize = mp_mul_scratchspace(2*rw, rw, rw);
    mp_int *scratch_orig = mp_make_sized(6 * rw + mul_scratchsize);
    mp_int scratch_per_iter = *scratch_orig;
    mp_int mul_scratch = mp_alloc_from_scratch(
        &scratch_per_iter, mul_scratchsize);

    r->w[0] = 1;

    for (size_t b = 1; b < p; b <<= 1) {
        /*
         * In each step of this iteration, we have the inverse of x
         * mod 2^b, and we want the inverse of x mod 2^{2b}.
         *
         * Write B = 2^b for convenience, so we want x^{-1} mod B^2.
         * Let x = x_0 + B x_1 + k B^2, with 0 <= x_0,x_1 < B.
         *
         * We want to find r_0 and r_1 such that
         *    (r_1 B + r_0) (x_1 B + x_0) == 1 (mod B^2)
         *
         * To begin with, we know r_0 must be the inverse mod B of
         * x_0, i.e. of x, i.e. it is the inverse we computed in the
         * previous iteration. So now all we need is r_1.
         *
         * Multiplying out, neglecting multiples of B^2, and writing
         * x_0 r_0 = K B + 1, we have
         *
         *    r_1 x_0 B + r_0 x_1 B + K B == 0                    (mod B^2)
         * =>                   r_1 x_0 B == - r_0 x_1 B - K B    (mod B^2)
         * =>                     r_1 x_0 == - r_0 x_1 - K        (mod B)
         * =>                         r_1 == r_0 (- r_0 x_1 - K)  (mod B)
         *
         * (the last step because we multiply through by the inverse
         * of x_0, which we already know is r_0).
         */

        mp_int scratch_this_iter = scratch_per_iter;
        size_t Bw = (b + BIGNUM_INT_BITS - 1) / BIGNUM_INT_BITS;
        size_t B2w = (2*b + BIGNUM_INT_BITS - 1) / BIGNUM_INT_BITS;

        /* Start by finding K: multiply x_0 by r_0, and shift down. */
        mp_int x0 = mp_alloc_from_scratch(&scratch_this_iter, Bw);
        mp_copy_into(&x0, x);
        mp_reduce_mod_2to(&x0, b);
        mp_int r0 = mp_make_alias(r, 0, Bw);
        mp_int Kshift = mp_alloc_from_scratch(&scratch_this_iter, B2w);
        mp_mul_internal(&Kshift, &x0, &r0, mul_scratch);
        mp_int K = mp_alloc_from_scratch(&scratch_this_iter, Bw);
        mp_rshift_fixed_into(&K, &Kshift, b);

        /* Now compute the product r_0 x_1, reusing the space of Kshift. */
        mp_int x1 = mp_alloc_from_scratch(&scratch_this_iter, Bw);
        mp_rshift_fixed_into(&x1, x, b);
        mp_reduce_mod_2to(&x1, b);
        mp_int r0x1 = mp_make_alias(&Kshift, 0, Bw);
        mp_mul_internal(&r0x1, &r0, &x1, mul_scratch);

        /* Add K to that. */
        mp_add_into(&r0x1, &r0x1, &K);

        /* Negate it. */
        mp_neg_into(&r0x1, &r0x1);

        /* Multiply by r_0. */
        mp_int r1 = mp_alloc_from_scratch(&scratch_this_iter, Bw);
        mp_mul_internal(&r1, &r0, &r0x1, mul_scratch);
        mp_reduce_mod_2to(&r1, b);

        /* That's our r_1, so add it on to r_0 to get the full inverse
         * output from this iteration. */
        mp_lshift_fixed_into(&K, &r1, (b % BIGNUM_INT_BITS));
        size_t Bpos = b / BIGNUM_INT_BITS;
        mp_int r1_position = mp_make_alias(r, Bpos, B2w-Bpos);
        mp_add_into(&r1_position, &r1_position, &K);
    }

    /* Finally, reduce mod the precise desired number of bits. */
    mp_reduce_mod_2to(r, p);

    mp_free(scratch_orig);
    return r;
}